

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O2

shared_ptr<binlog::Session::Channel> __thiscall
binlog::Session::createChannel(Session *this,size_t queueCapacity,WriterProp *writerProp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<binlog::Session::Channel> sVar1;
  undefined1 auStack_38 [16];
  undefined8 local_28;
  
  local_28 = writerProp;
  std::mutex::lock((mutex *)queueCapacity);
  std::make_shared<binlog::Session::Channel,binlog::Session&,unsigned_long&,binlog::WriterProp>
            ((Session *)auStack_38,(unsigned_long *)queueCapacity,
             (WriterProp *)&stack0xffffffffffffffd8);
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>
  ::emplace_back<std::shared_ptr<binlog::Session::Channel>>
            ((vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>
              *)(queueCapacity + 0x28),(shared_ptr<binlog::Session::Channel> *)auStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  std::__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)(queueCapacity + 0x30) + -0x10));
  pthread_mutex_unlock((pthread_mutex_t *)queueCapacity);
  sVar1.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<binlog::Session::Channel>)
         sVar1.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Session::Channel> Session::createChannel(std::size_t queueCapacity, WriterProp writerProp)
{
  std::lock_guard<std::mutex> lock(_mutex);

  _channels.push_back(std::make_shared<Channel>(*this, queueCapacity, std::move(writerProp)));
  return _channels.back();
}